

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmrun.cpp
# Opt level: O3

uchar * __thiscall vmrun_prop_eval::get_prop(vmrun_prop_eval *this)

{
  vm_prop_id_t vVar1;
  vm_datatype_t vVar2;
  vm_datatype_t *pvVar3;
  vm_val_t *pvVar4;
  int iVar5;
  uchar *puVar6;
  
  iVar5 = get_prop_no_eval(this);
  if (iVar5 != 0) {
LAB_001e0a2f:
    puVar6 = eval_prop_val(this);
    return puVar6;
  }
  if (G_predef_X.prop_not_defined_prop != 0) {
    vVar1 = this->target_prop;
    this->target_prop = G_predef_X.prop_not_defined_prop;
    iVar5 = get_prop_no_eval(this);
    pvVar4 = sp_;
    if (iVar5 != 0) {
      vVar2 = (this->val).typ;
      if ((vVar2 < VM_FIRST_INVALID_TYPE) && ((0x60800U >> (vVar2 & (VM_BIFPTR|VM_ENUM)) & 1) != 0))
      {
        pvVar3 = &sp_->typ;
        sp_ = sp_ + 1;
        *pvVar3 = VM_PROP;
        (pvVar4->val).prop = vVar1;
        this->argc = this->argc + 1;
      }
      goto LAB_001e0a2f;
    }
  }
  sp_ = sp_ + -(long)(int)this->argc;
  r0_.typ = VM_NIL;
  return entry_ptr_native_ + this->caller_ofs;
}

Assistant:

const uchar *get_prop(VMG0_)
    {
        /* find the property without evaluating it */
        if (get_prop_no_eval(vmg0_))
            return eval_prop_val(vmg0_);

        /* try propNotDefined */
        if (G_predef->prop_not_defined_prop != VM_INVALID_PROP)
        {
            /* save the original target property */
            vm_prop_id_t real_target_prop = target_prop;
            
            /* look up propNotDefined */
            target_prop = G_predef->prop_not_defined_prop;
            if (get_prop_no_eval(vmg0_))
            {
                /* if we found a method, set up to call it */
                if (val.typ == VM_CODEOFS
                    || val.typ == VM_OBJX
                    || val.typ == VM_BIFPTRX)
                {
                    /* 
                     *   add the target property as the additional first
                     *   argument to propNotDefined (we push backwards, so
                     *   this will conveniently become the new first
                     *   argument) 
                     */
                    G_stk->push()->set_propid(real_target_prop);
                    
                    /* count the additional argument */
                    ++argc;
                }
                
                return eval_prop_val(vmg0_);
            }
        }
            
        /* 
         *   the property or method is not defined - discard arguments and
         *   set R0 to nil 
         */
        G_stk->discard(argc);
        G_interpreter->get_r0()->set_nil();

        /* resume execution where we left off */
        return G_interpreter->get_entry_ptr() + caller_ofs;
    }